

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string_sprintf.c
# Opt level: O0

void append_int(archive_string *as,intmax_t d,uint base)

{
  uintmax_t local_30;
  uintmax_t local_28;
  uintmax_t ud;
  uint base_local;
  intmax_t d_local;
  archive_string *as_local;
  
  local_28 = d;
  if (d < 0) {
    archive_strappend_char(as,'-');
    if (d == -0x8000000000000000) {
      local_30 = 0x8000000000000000;
    }
    else {
      local_30 = -d;
    }
    local_28 = local_30;
  }
  append_uint(as,local_28,base);
  return;
}

Assistant:

static void
append_int(struct archive_string *as, intmax_t d, unsigned base)
{
	uintmax_t ud;

	if (d < 0) {
		archive_strappend_char(as, '-');
		ud = (d == INTMAX_MIN) ? (uintmax_t)(INTMAX_MAX) + 1 : (uintmax_t)(-d);
	} else
		ud = d;
	append_uint(as, ud, base);
}